

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::AddNodeHashes
               (aiNode *node,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *hashes)

{
  uint local_34;
  uint i;
  uint32_t local_1c;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_18;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *hashes_local;
  aiNode *node_local;
  
  local_18 = hashes;
  hashes_local = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)node;
  if ((node->mName).length != 0) {
    local_1c = SuperFastHash((node->mName).data,(node->mName).length,0);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              (hashes,&local_1c);
  }
  for (local_34 = 0; local_34 < *(uint *)&hashes_local[0x17]._M_t._M_impl; local_34 = local_34 + 1)
  {
    AddNodeHashes(*(aiNode **)
                   (*(long *)&hashes_local[0x17]._M_t._M_impl.super__Rb_tree_header._M_header +
                   (ulong)local_34 * 8),local_18);
  }
  return;
}

Assistant:

void SceneCombiner::AddNodeHashes(aiNode* node, std::set<unsigned int>& hashes) {
    // Add node name to hashing set if it is non-empty - empty nodes are allowed
    // and they can't have any anims assigned so its absolutely safe to duplicate them.
    if (node->mName.length) {
        hashes.insert( SuperFastHash(node->mName.data, static_cast<uint32_t>(node->mName.length)) );
    }

    // Process all children recursively
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        AddNodeHashes(node->mChildren[i],hashes);
}